

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_yangversion(lysp_yang_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  ly_ctx *local_78;
  ly_ctx *local_68;
  ly_ctx *local_60;
  ly_ctx *local_58;
  bool local_49;
  LY_ERR ret___1;
  ly_stmt lStack_44;
  ly_bool __loop_end;
  LY_ERR ret__;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_module *plStack_20;
  LY_ERR ret;
  lysp_module *mod_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  plStack_20 = mod;
  mod_local = (lysp_module *)ctx;
  if (mod->version != '\0') {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_58 = (ly_ctx *)0x0;
    }
    else {
      local_58 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_58,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","yang-version");
    return LY_EVALID;
  }
  LVar1 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,(char **)&word_len,&word,(size_t *)&ret__);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if ((_ret__ == 1) && (iVar2 = strncmp((char *)word_len,"1",1), iVar2 == 0)) {
    plStack_20->version = '\x01';
  }
  else {
    if ((_ret__ != 3) || (iVar2 = strncmp((char *)word_len,"1.1",3), iVar2 != 0)) {
      if (mod_local == (lysp_module *)0x0) {
        local_60 = (ly_ctx *)0x0;
      }
      else {
        local_60 = *(ly_ctx **)
                    **(undefined8 **)
                      (mod_local->typedefs->units +
                      (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
      }
      ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
              _ret__ & 0xffffffff,word_len,"yang-version");
      free(word);
      return LY_EVALID;
    }
    plStack_20->version = '\x02';
  }
  free(word);
  buf._4_4_ = get_keyword((lysp_yang_ctx *)mod_local,&stack0xffffffffffffffbc,(char **)&word_len,
                          (size_t *)&ret__);
  if (buf._4_4_ != LY_SUCCESS) {
    return buf._4_4_;
  }
  if (lStack_44 == LY_STMT_SYNTAX_SEMICOLON) {
    local_49 = true;
  }
  else {
    if (lStack_44 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (mod_local == (lysp_module *)0x0) {
        local_68 = (ly_ctx *)0x0;
      }
      else {
        local_68 = *(ly_ctx **)
                    **(undefined8 **)
                      (mod_local->typedefs->units +
                      (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
      }
      pcVar3 = lyplg_ext_stmt2str(lStack_44);
      ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX_YANG,
              "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
      return LY_EVALID;
    }
    LVar1 = get_keyword((lysp_yang_ctx *)mod_local,&stack0xffffffffffffffbc,(char **)&word_len,
                        (size_t *)&ret__);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    local_49 = lStack_44 == LY_STMT_SYNTAX_RIGHT_BRACE;
  }
  while( true ) {
    buf._4_4_ = 0;
    if (local_49) {
      return LY_SUCCESS;
    }
    if (lStack_44 != LY_STMT_EXTENSION_INSTANCE) {
      if (mod_local == (lysp_module *)0x0) {
        local_78 = (ly_ctx *)0x0;
      }
      else {
        local_78 = *(ly_ctx **)
                    **(undefined8 **)
                      (mod_local->typedefs->units +
                      (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
      }
      pcVar3 = lyplg_ext_stmt2str(lStack_44);
      ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
              pcVar3,"yang-version");
      return LY_EVALID;
    }
    LVar1 = parse_ext((lysp_yang_ctx *)mod_local,(char *)word_len,_ret__,plStack_20,
                      LY_STMT_YANG_VERSION,0,&plStack_20->exts);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    LVar1 = get_keyword((lysp_yang_ctx *)mod_local,&stack0xffffffffffffffbc,(char **)&word_len,
                        (size_t *)&ret__);
    if (LVar1 != LY_SUCCESS) break;
    if (lStack_44 == LY_STMT_SYNTAX_RIGHT_BRACE) {
      local_49 = true;
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
parse_yangversion(struct lysp_yang_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (mod->version) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "yang-version");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    if ((word_len == 1) && !strncmp(word, "1", word_len)) {
        mod->version = LYS_VERSION_1_0;
    } else if ((word_len == ly_strlen_const("1.1")) && !strncmp(word, "1.1", word_len)) {
        mod->version = LYS_VERSION_1_1;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "yang-version");
        free(buf);
        return LY_EVALID;
    }
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, mod, LY_STMT_YANG_VERSION, 0, &mod->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "yang-version");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}